

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_SimpleEmptyKey::_Run(_Test_SimpleEmptyKey *this)

{
  int iVar1;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  Random local_18;
  int local_14;
  Random rnd;
  int i;
  _Test_SimpleEmptyKey *this_local;
  
  _rnd = this;
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    Harness::Init(&this->super_Harness,(TestArgs *)(kTestArgList + (long)local_14 * 0xc));
    iVar1 = test::RandomSeed();
    Random::Random(&local_18,iVar1 + 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"v",&local_71);
    Harness::Add(&this->super_Harness,(string *)local_38,(string *)local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Harness::Test(&this->super_Harness,&local_18);
  }
  return;
}

Assistant:

TEST(Harness, SimpleEmptyKey) {
  for (int i = 0; i < kNumTestArgs; i++) {
    Init(kTestArgList[i]);
    Random rnd(test::RandomSeed() + 1);
    Add("", "v");
    Test(&rnd);
  }
}